

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzrule.cpp
# Opt level: O0

UBool __thiscall
icu_63::AnnualTimeZoneRule::getStartInYear
          (AnnualTimeZoneRule *this,int32_t year,int32_t prevRawOffset,int32_t prevDSTSavings,
          UDate *result)

{
  int8_t iVar1;
  UBool UVar2;
  DateRuleType DVar3;
  int32_t iVar4;
  int32_t iVar5;
  int32_t month_00;
  TimeRuleType TVar6;
  int local_80;
  int local_7c;
  int local_54;
  int32_t delta;
  int32_t dow;
  int32_t dom;
  int32_t month;
  int32_t weeks;
  UBool after;
  double dStack_38;
  DateRuleType type;
  double ruleDay;
  UDate *result_local;
  int32_t prevDSTSavings_local;
  int32_t prevRawOffset_local;
  int32_t year_local;
  AnnualTimeZoneRule *this_local;
  
  if ((year < this->fStartYear) || (this->fEndYear < year)) {
    this_local._7_1_ = '\0';
  }
  else {
    DVar3 = DateTimeRule::getDateRuleType(this->fDateTimeRule);
    if (DVar3 == DOM) {
      iVar4 = DateTimeRule::getRuleMonth(this->fDateTimeRule);
      iVar5 = DateTimeRule::getRuleDayOfMonth(this->fDateTimeRule);
      dStack_38 = Grego::fieldsToDay(year,iVar4,iVar5);
    }
    else {
      month._3_1_ = true;
      if (DVar3 == DOW) {
        iVar4 = DateTimeRule::getRuleWeekInMonth(this->fDateTimeRule);
        if (iVar4 < 1) {
          iVar5 = DateTimeRule::getRuleMonth(this->fDateTimeRule);
          month_00 = DateTimeRule::getRuleMonth(this->fDateTimeRule);
          iVar1 = Grego::monthLength(year,month_00);
          dStack_38 = Grego::fieldsToDay(year,iVar5,(int)iVar1);
          dStack_38 = (double)((iVar4 + 1) * 7) + dStack_38;
        }
        else {
          iVar5 = DateTimeRule::getRuleMonth(this->fDateTimeRule);
          dStack_38 = Grego::fieldsToDay(year,iVar5,1);
          dStack_38 = (double)((iVar4 + -1) * 7) + dStack_38;
        }
        month._3_1_ = iVar4 >= 1;
      }
      else {
        iVar4 = DateTimeRule::getRuleMonth(this->fDateTimeRule);
        delta = DateTimeRule::getRuleDayOfMonth(this->fDateTimeRule);
        if ((((DVar3 == DOW_LEQ_DOM) && (month._3_1_ = false, iVar4 == 1)) && (delta == 0x1d)) &&
           (UVar2 = Grego::isLeapYear(year), UVar2 == '\0')) {
          delta = 0x1c;
        }
        dStack_38 = Grego::fieldsToDay(year,iVar4,delta);
      }
      iVar4 = Grego::dayOfWeek(dStack_38);
      iVar5 = DateTimeRule::getRuleDayOfWeek(this->fDateTimeRule);
      local_80 = iVar5 - iVar4;
      if (month._3_1_) {
        local_7c = local_80;
        if (local_80 < 0) {
          local_7c = local_80 + 7;
        }
        local_54 = local_7c;
      }
      else {
        if (0 < local_80) {
          local_80 = local_80 + -7;
        }
        local_54 = local_80;
      }
      dStack_38 = (double)local_54 + dStack_38;
    }
    iVar4 = DateTimeRule::getRuleMillisInDay(this->fDateTimeRule);
    *result = dStack_38 * 86400000.0 + (double)iVar4;
    TVar6 = DateTimeRule::getTimeRuleType(this->fDateTimeRule);
    if (TVar6 != UTC_TIME) {
      *result = *result - (double)prevRawOffset;
    }
    TVar6 = DateTimeRule::getTimeRuleType(this->fDateTimeRule);
    if (TVar6 == WALL_TIME) {
      *result = *result - (double)prevDSTSavings;
    }
    this_local._7_1_ = '\x01';
  }
  return this_local._7_1_;
}

Assistant:

UBool
AnnualTimeZoneRule::getStartInYear(int32_t year,
                                   int32_t prevRawOffset,
                                   int32_t prevDSTSavings,
                                   UDate &result) const {
    if (year < fStartYear || year > fEndYear) {
        return FALSE;
    }
    double ruleDay;
    DateTimeRule::DateRuleType type = fDateTimeRule->getDateRuleType();
    if (type == DateTimeRule::DOM) {
        ruleDay = Grego::fieldsToDay(year, fDateTimeRule->getRuleMonth(), fDateTimeRule->getRuleDayOfMonth());
    } else {
        UBool after = TRUE;
        if (type == DateTimeRule::DOW) {
            // Normalize DOW rule into DOW_GEQ_DOM or DOW_LEQ_DOM
            int32_t weeks = fDateTimeRule->getRuleWeekInMonth();
            if (weeks > 0) {
                ruleDay = Grego::fieldsToDay(year, fDateTimeRule->getRuleMonth(), 1);
                ruleDay += 7 * (weeks - 1);
            } else {
                after = FALSE;
                ruleDay = Grego::fieldsToDay(year, fDateTimeRule->getRuleMonth(),
                    Grego::monthLength(year, fDateTimeRule->getRuleMonth()));
                ruleDay += 7 * (weeks + 1);
           }
        } else {
            int32_t month = fDateTimeRule->getRuleMonth();
            int32_t dom = fDateTimeRule->getRuleDayOfMonth();
            if (type == DateTimeRule::DOW_LEQ_DOM) {
                after = FALSE;
                // Handle Feb <=29
                if (month == UCAL_FEBRUARY && dom == 29 && !Grego::isLeapYear(year)) {
                    dom--;
                }
            }
            ruleDay = Grego::fieldsToDay(year, month, dom);
        }
        int32_t dow = Grego::dayOfWeek(ruleDay);
        int32_t delta = fDateTimeRule->getRuleDayOfWeek() - dow;
        if (after) {
            delta = delta < 0 ? delta + 7 : delta;
        } else {
            delta = delta > 0 ? delta - 7 : delta;
        }
        ruleDay += delta;
    }

    result = ruleDay*U_MILLIS_PER_DAY + fDateTimeRule->getRuleMillisInDay();
    if (fDateTimeRule->getTimeRuleType() != DateTimeRule::UTC_TIME) {
        result -= prevRawOffset;
    }
    if (fDateTimeRule->getTimeRuleType() == DateTimeRule::WALL_TIME) {
        result -= prevDSTSavings;
    }
    return TRUE;
}